

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Sorted(WindowDistinctAggregatorLocalState *this)

{
  GlobalSortStatePtr *this_00;
  DataChunk *chunk;
  SBScanState *pSVar1;
  WindowAggregator *pWVar2;
  pointer puVar3;
  int iVar4;
  type pGVar5;
  PayloadScanner *this_01;
  pointer pPVar6;
  reference pvVar7;
  pointer pGVar8;
  ulong uVar9;
  type pSVar10;
  reference pvVar11;
  size_type sVar12;
  ulong uVar13;
  size_type sVar14;
  unsigned_long uVar15;
  templated_unique_single_t scanner;
  SBIterator prev;
  SBIterator curr;
  SortLayout prefix_layout;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> local_3c0;
  size_type *local_3b8;
  reference local_3b0;
  data_ptr_t *local_3a8;
  data_ptr_t *local_3a0;
  unsigned_long local_398;
  SBIterator local_390;
  SBIterator local_2a8;
  SortLayout local_1c0;
  
  this_00 = &this->gastate->global_sort;
  local_3b0 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
              ::operator[](&(this->gastate->zipped_tree).tree,0);
  pWVar2 = (this->gastate->super_WindowAggregatorGlobalState).aggregator;
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  this_01 = (PayloadScanner *)operator_new(0x18);
  PayloadScanner::PayloadScanner(this_01,pGVar5,this->block_idx,false);
  puVar3 = (this->gastate->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
           .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_3c0._M_head_impl = this_01;
  if ((ulong)((long)(this->gastate->block_starts).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <= this->block_idx + 1) {
    ::std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  local_398 = puVar3[this->block_idx + 1];
  pPVar6 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
           operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                       *)&local_3c0);
  chunk = &this->payload_chunk;
  PayloadScanner::Scan(pPVar6,chunk);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,0);
  local_3b8 = (size_type *)pvVar7->data;
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  SBIterator::SBIterator(&local_2a8,pGVar5,COMPARE_LESSTHAN,0);
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  SBIterator::SBIterator(&local_390,pGVar5,COMPARE_LESSTHAN,0);
  pGVar8 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  SortLayout::GetPrefixComparisonLayout
            (&local_1c0,&pGVar8->sort_layout,
             ((long)(pWVar2->arg_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pWVar2->arg_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  puVar3 = (this->gastate->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
           .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->block_idx <
      (ulong)((long)(this->gastate->block_starts).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
    uVar15 = puVar3[this->block_idx];
    if (uVar15 == 0) {
      sVar12 = *local_3b8;
      pvVar11 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                          (&local_3b0->first,sVar12);
      (pvVar11->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
      (pvVar11->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = sVar12;
      pvVar11 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                          (&this->gastate->seconds,this->block_idx);
      uVar9 = 1;
      sVar14 = sVar12;
    }
    else {
      uVar13 = uVar15 - 1;
      uVar9 = uVar13 / local_2a8.block_capacity;
      if (uVar9 != local_2a8.scan.block_idx) {
        pSVar1 = &local_2a8.scan;
        SBScanState::SetIndices(pSVar1,uVar9,0);
        if (uVar9 < local_2a8.block_count) {
          SBScanState::PinRadix(pSVar1,local_2a8.scan.block_idx);
          local_2a8.block_ptr = SBScanState::RadixPtr(pSVar1);
          if (local_2a8.all_constant == false) {
            pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                      ::operator*(&(local_2a8.scan.sb)->blob_sorting_data);
            SBScanState::PinData(pSVar1,pSVar10);
          }
        }
      }
      local_2a8.scan.entry_idx = uVar13 % local_2a8.block_capacity;
      local_2a8.entry_ptr = local_2a8.block_ptr + local_2a8.scan.entry_idx * local_2a8.entry_size;
      uVar9 = uVar13 / local_390.block_capacity;
      local_2a8.entry_idx = uVar13;
      if (uVar9 != local_390.scan.block_idx) {
        pSVar1 = &local_390.scan;
        SBScanState::SetIndices(pSVar1,uVar9,0);
        if (uVar9 < local_390.block_count) {
          SBScanState::PinRadix(pSVar1,local_390.scan.block_idx);
          local_390.block_ptr = SBScanState::RadixPtr(pSVar1);
          if (local_390.all_constant == false) {
            pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                      ::operator*(&(local_390.scan.sb)->blob_sorting_data);
            SBScanState::PinData(pSVar1,pSVar10);
          }
        }
      }
      local_390.scan.entry_idx = uVar13 % local_390.block_capacity;
      local_390.entry_ptr = local_390.block_ptr + local_390.scan.entry_idx * local_390.entry_size;
      sVar12 = *local_3b8;
      local_390.entry_idx = uVar13;
      pvVar11 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                          (&this->gastate->seconds,this->block_idx);
      uVar9 = 0;
      sVar14 = 0;
    }
    (pvVar11->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = sVar12;
    SBIterator::operator++(&local_2a8);
    local_3a8 = &local_390.entry_ptr;
    local_3a0 = &local_2a8.entry_ptr;
    while (local_2a8.entry_idx < local_398) {
      if ((this->payload_chunk).count <= uVar9) {
        DataChunk::Reset(chunk);
        pPVar6 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                 ::operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                               *)&local_3c0);
        PayloadScanner::Scan(pPVar6,chunk);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,0);
        local_3b8 = (size_type *)pvVar7->data;
        uVar9 = 0;
      }
      sVar12 = local_3b8[uVar9];
      if (local_1c0.all_constant == true) {
        iVar4 = FastMemcmp(local_390.entry_ptr,local_2a8.entry_ptr,local_1c0.comparison_size);
      }
      else {
        iVar4 = Comparators::CompareTuple
                          (&local_390.scan,&local_2a8.scan,local_3a8,local_3a0,&local_1c0,
                           &local_390.external);
      }
      if (iVar4 == 0) {
        pvVar11 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                            (&local_3b0->first,sVar12);
        uVar15 = sVar14 + 1;
      }
      else {
        pvVar11 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                            (&local_3b0->first,sVar12);
        uVar15 = 0;
      }
      (pvVar11->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar15;
      (pvVar11->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = sVar12;
      SBIterator::operator++(&local_2a8);
      uVar9 = uVar9 + 1;
      SBIterator::operator++(&local_390);
      sVar14 = sVar12;
    }
    pvVar11 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                        (&this->gastate->seconds,this->block_idx);
    (pvVar11->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         sVar14;
    SortLayout::~SortLayout(&local_1c0);
    BufferHandle::~BufferHandle(&local_390.scan.payload_heap_handle);
    BufferHandle::~BufferHandle(&local_390.scan.payload_data_handle);
    BufferHandle::~BufferHandle(&local_390.scan.blob_sorting_heap_handle);
    BufferHandle::~BufferHandle(&local_390.scan.blob_sorting_data_handle);
    BufferHandle::~BufferHandle(&local_390.scan.radix_handle);
    BufferHandle::~BufferHandle(&local_2a8.scan.payload_heap_handle);
    BufferHandle::~BufferHandle(&local_2a8.scan.payload_data_handle);
    BufferHandle::~BufferHandle(&local_2a8.scan.blob_sorting_heap_handle);
    BufferHandle::~BufferHandle(&local_2a8.scan.blob_sorting_data_handle);
    BufferHandle::~BufferHandle(&local_2a8.scan.radix_handle);
    if (local_3c0._M_head_impl != (PayloadScanner *)0x0) {
      ::std::default_delete<duckdb::PayloadScanner>::operator()
                ((default_delete<duckdb::PayloadScanner> *)&local_3c0,local_3c0._M_head_impl);
    }
    return;
  }
  ::std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void WindowDistinctAggregatorLocalState::Sorted() {
	using ZippedTuple = WindowDistinctAggregatorGlobalState::ZippedTuple;
	auto &global_sort = gastate.global_sort;
	auto &prev_idcs = gastate.zipped_tree.LowestLevel();
	auto &aggregator = gastate.aggregator;
	auto &scan_chunk = payload_chunk;

	auto scanner = make_uniq<PayloadScanner>(*global_sort, block_idx);
	const auto in_size = gastate.block_starts.at(block_idx + 1);
	scanner->Scan(scan_chunk);
	idx_t scan_idx = 0;

	auto *input_idx = FlatVector::GetData<idx_t>(scan_chunk.data[0]);
	idx_t i = 0;

	SBIterator curr(*global_sort, ExpressionType::COMPARE_LESSTHAN);
	SBIterator prev(*global_sort, ExpressionType::COMPARE_LESSTHAN);
	auto prefix_layout = global_sort->sort_layout.GetPrefixComparisonLayout(aggregator.arg_types.size());

	const auto block_begin = gastate.block_starts.at(block_idx);
	if (!block_begin) {
		// First block, so set up initial sentinel
		i = input_idx[scan_idx++];
		prev_idcs[i] = ZippedTuple(0, i);
		std::get<0>(gastate.seconds[block_idx]) = i;
	} else {
		// Move to the to end of the previous block
		// so we can record the comparison result for the first row
		curr.SetIndex(block_begin - 1);
		prev.SetIndex(block_begin - 1);
		scan_idx = 0;
		std::get<0>(gastate.seconds[block_idx]) = input_idx[scan_idx];
	}

	//	8:	for i ← 1 to in.size do
	for (++curr; curr.GetIndex() < in_size; ++curr, ++prev) {
		//	Scan second one chunk at a time
		//	Note the scan is one behind the iterators
		if (scan_idx >= scan_chunk.size()) {
			scan_chunk.Reset();
			scanner->Scan(scan_chunk);
			scan_idx = 0;
			input_idx = FlatVector::GetData<idx_t>(scan_chunk.data[0]);
		}
		auto second = i;
		i = input_idx[scan_idx++];

		int lt = 0;
		if (prefix_layout.all_constant) {
			lt = FastMemcmp(prev.entry_ptr, curr.entry_ptr, prefix_layout.comparison_size);
		} else {
			lt = Comparators::CompareTuple(prev.scan, curr.scan, prev.entry_ptr, curr.entry_ptr, prefix_layout,
			                               prev.external);
		}

		//	9:	if sorted[i].first == sorted[i-1].first then
		//	10:		prevIdcs[i] ← sorted[i-1].second
		//	11:	else
		//	12:		prevIdcs[i] ← “-”
		if (!lt) {
			prev_idcs[i] = ZippedTuple(second + 1, i);
		} else {
			prev_idcs[i] = ZippedTuple(0, i);
		}
	}

	// Save the last value of i for patching up the block boundaries
	std::get<1>(gastate.seconds[block_idx]) = i;
}